

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O3

i8 __thiscall idx2::DecodeTransformOrder(idx2 *this,u64 Input,v3i N3,str Output)

{
  long lVar1;
  ulong uVar2;
  char cVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx2 *piVar8;
  idx2 *piVar9;
  uint uVar10;
  uint local_14 [3];
  
  lVar4 = CONCAT44((int)((ulong)register0x00000008 >> 0x20),N3.field_0._8_4_);
  uVar2 = 1;
  uVar6 = 1;
  if ((int)Input != 0) {
    uVar7 = (long)(int)Input - 1;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar6 = 1;
    if (uVar7 != 0) {
      uVar6 = 1L << (-((byte)lVar1 ^ 0x3f) & 0x3f) & 0xffffffff;
    }
  }
  if (Input >> 0x20 != 0) {
    uVar7 = ((long)Input >> 0x20) - 1;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = 1;
    if (uVar7 != 0) {
      uVar2 = 1L << (-((byte)lVar1 ^ 0x3f) & 0x3f) & 0xffffffff;
    }
  }
  if (N3.field_0._0_4_ == 0) {
    uVar7 = 1;
  }
  else {
    uVar5 = (long)N3.field_0._0_4_ - 1;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar7 = 1;
    if (uVar5 != 0) {
      uVar7 = 1L << (-((byte)lVar1 ^ 0x3f) & 0x3f) & 0xffffffff;
    }
  }
  local_14[0] = (uint)uVar6;
  local_14[1] = (uint)uVar2;
  local_14[2] = (uint)uVar7;
  if ((ulong)((long)(int)(uint)uVar7 * (long)(int)(uint)uVar2 * (long)(int)(uint)uVar6) < 2) {
    cVar3 = '\0';
  }
  else {
    cVar3 = '\0';
    piVar9 = this;
    do {
      uVar10 = (uint)piVar9 & 3;
      piVar8 = (idx2 *)((ulong)piVar9 >> 2);
      if (uVar10 == 3) {
        piVar9 = this;
        if (piVar8 != (idx2 *)0x3) {
          this = piVar8;
          piVar9 = piVar8;
        }
      }
      else {
        *(byte *)(lVar4 + cVar3) = (byte)uVar10 | 0x58;
        local_14[(uint)piVar9 & 3] = (int)local_14[(uint)piVar9 & 3] >> 1;
        cVar3 = cVar3 + '\x01';
        uVar6 = (ulong)local_14[0];
        uVar2 = (ulong)local_14[1];
        uVar7 = (ulong)local_14[2];
        piVar9 = piVar8;
      }
    } while (1 < (ulong)((long)(int)uVar7 * (long)(int)uVar2 * (long)(int)uVar6));
  }
  *(undefined1 *)(lVar4 + cVar3) = 0;
  return cVar3;
}

Assistant:

i8
DecodeTransformOrder(u64 Input, v3i N3, str Output)
{
  N3 = v3i((int)NextPow2(N3.X), (int)NextPow2(N3.Y), (int)NextPow2(N3.Z));
  i8 Len = 0;
  u64 SavedInput = Input;
  while (Prod<u64>(N3) > 1)
  {
    int T = Input & 0x3;
    Input >>= 2;
    if (T == 3)
    {
      if (Input == 3)
        Input = SavedInput;
      else
        SavedInput = Input;
    }
    else
    {
      Output[Len++] = char('X' + T);
      N3[T] >>= 1;
    }
  }
  Output[Len] = '\0';
  return Len;
}